

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_14x14(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp26;
  JLONG tmp25;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp16;
  JLONG tmp15;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  int local_2a8 [16];
  int local_268 [8];
  int local_248 [8];
  int local_228 [8];
  int local_208 [8];
  int local_1e8 [8];
  int local_1c8 [8];
  int local_1a8 [8];
  int local_188 [8];
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  int local_108 [9];
  int local_e4;
  long local_e0;
  int *local_d0;
  short *local_c8;
  short *local_c0;
  long local_98;
  long local_90;
  long local_88;
  int local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_e0 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_c8 = *(short **)(in_RSI + 0x58);
  local_d0 = local_2a8;
  local_c0 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_e4 = 0; local_e4 < 8; local_e4 = local_e4 + 1) {
    lVar1 = (long)((int)*local_c0 * (int)*local_c8) * 0x2000 + 0x400;
    lVar2 = (long)((int)local_c0[0x20] * (int)local_c8[0x20]);
    local_98 = lVar1 + lVar2 * 0x28c6;
    local_90 = lVar1 + lVar2 * 0xa12;
    local_88 = lVar1 + lVar2 * -0x1c37;
    local_80 = (int)(lVar1 + lVar2 * -0x2d42 >> 0xb);
    lVar1 = (long)((int)local_c0[0x10] * (int)local_c8[0x10]);
    lVar2 = (long)((int)local_c0[0x30] * (int)local_c8[0x30]);
    lVar3 = (lVar1 + lVar2) * 0x2362;
    lVar4 = lVar3 + lVar1 * 0x8bd;
    lVar3 = lVar3 + lVar2 * -0x3704;
    lVar1 = lVar1 * 0x13a3 + lVar2 * -0x2c1f;
    local_68 = local_98 + lVar4;
    local_98 = local_98 - lVar4;
    local_70 = local_90 + lVar3;
    local_90 = local_90 - lVar3;
    local_78 = local_88 + lVar1;
    local_88 = local_88 - lVar1;
    lVar1 = (long)((int)local_c0[8] * (int)local_c8[8]);
    lVar2 = (long)((int)local_c0[0x18] * (int)local_c8[0x18]);
    lVar4 = (long)((int)local_c0[0x28] * (int)local_c8[0x28]);
    lVar3 = (long)((int)local_c0[0x38] * (int)local_c8[0x38]);
    local_38 = (lVar1 + lVar2) * 0x2ab7;
    local_40 = (lVar1 + lVar4) * 0x2652;
    local_30 = local_38 + local_40 + lVar3 * 0x2000 + lVar1 * -0x2410;
    local_50 = (lVar1 + lVar4) * 0x1814;
    local_58 = (lVar1 - lVar2) * 0xef2 + lVar3 * -0x2000;
    local_60 = local_58 + local_50 + lVar1 * -0x21f5;
    lVar5 = (lVar2 + lVar4) * -0x511 + lVar3 * -0x2000;
    local_38 = lVar5 + lVar2 * -0xd92 + local_38;
    local_40 = lVar5 + lVar4 * -0x4bf7 + local_40;
    lVar5 = (lVar4 - lVar2) * 0x2cf8;
    local_50 = lVar5 + lVar3 * 0x2000 + lVar4 * -0x361a + local_50;
    local_58 = lVar5 + lVar2 * 0x1599 + local_58;
    local_48 = (((int)local_c0[0x38] * (int)local_c8[0x38] + (int)(lVar1 - lVar2)) -
               (int)local_c0[0x28] * (int)local_c8[0x28]) * 4;
    *local_d0 = (int)(local_68 + local_30 >> 0xb);
    local_d0[0x68] = (int)(local_68 - local_30 >> 0xb);
    local_d0[8] = (int)(local_70 + local_38 >> 0xb);
    local_d0[0x60] = (int)(local_70 - local_38 >> 0xb);
    local_d0[0x10] = (int)(local_78 + local_40 >> 0xb);
    local_d0[0x58] = (int)(local_78 - local_40 >> 0xb);
    local_d0[0x18] = local_80 + local_48;
    local_d0[0x50] = local_80 - local_48;
    local_d0[0x20] = (int)(local_88 + local_50 >> 0xb);
    local_d0[0x48] = (int)(local_88 - local_50 >> 0xb);
    local_d0[0x28] = (int)(local_90 + local_58 >> 0xb);
    local_d0[0x40] = (int)(local_90 - local_58 >> 0xb);
    local_d0[0x30] = (int)(local_98 + local_60 >> 0xb);
    local_d0[0x38] = (int)(local_98 - local_60 >> 0xb);
    local_c0 = local_c0 + 1;
    local_c8 = local_c8 + 1;
    local_d0 = local_d0 + 1;
  }
  local_d0 = local_2a8;
  for (local_e4 = 0; local_e4 < 0xe; local_e4 = local_e4 + 1) {
    puVar6 = (undefined1 *)(*(long *)(local_20 + (long)local_e4 * 8) + (ulong)local_24);
    lVar2 = ((long)*local_d0 + 0x10) * 0x2000;
    lVar1 = (long)local_d0[4];
    lVar7 = lVar2 + lVar1 * 0x28c6;
    lVar8 = lVar2 + lVar1 * 0xa12;
    lVar9 = lVar2 + lVar1 * -0x1c37;
    lVar2 = lVar2 + lVar1 * -0x2d42;
    lVar1 = (long)local_d0[2];
    lVar4 = (long)local_d0[6];
    lVar5 = (lVar1 + lVar4) * 0x2362;
    lVar3 = lVar5 + lVar1 * 0x8bd;
    lVar5 = lVar5 + lVar4 * -0x3704;
    lVar1 = lVar1 * 0x13a3 + lVar4 * -0x2c1f;
    lVar4 = lVar7 + lVar3;
    lVar7 = lVar7 - lVar3;
    lVar3 = lVar8 + lVar5;
    lVar8 = lVar8 - lVar5;
    lVar5 = lVar9 + lVar1;
    lVar9 = lVar9 - lVar1;
    lVar1 = (long)local_d0[1];
    lVar10 = (long)local_d0[3];
    lVar11 = (long)local_d0[5];
    lVar12 = (long)local_d0[7];
    lVar13 = lVar12 * 0x2000;
    lVar14 = (lVar1 + lVar10) * 0x2ab7;
    lVar15 = (lVar1 + lVar11) * 0x2652;
    lVar16 = lVar14 + lVar15 + lVar13 + lVar1 * -0x2410;
    lVar17 = (lVar1 + lVar11) * 0x1814;
    lVar18 = (lVar1 - lVar10) * 0xef2 + lVar12 * -0x2000;
    lVar19 = lVar18 + lVar17 + lVar1 * -0x21f5;
    lVar12 = (lVar10 + lVar11) * -0x511 + lVar12 * -0x2000;
    lVar14 = lVar12 + lVar10 * -0xd92 + lVar14;
    lVar15 = lVar12 + lVar11 * -0x4bf7 + lVar15;
    lVar12 = (lVar11 - lVar10) * 0x2cf8;
    lVar17 = lVar12 + lVar13 + lVar11 * -0x361a + lVar17;
    lVar18 = lVar12 + lVar10 * 0x1599 + lVar18;
    lVar13 = ((lVar1 - lVar10) - lVar11) * 0x2000 + lVar13;
    *puVar6 = *(undefined1 *)(local_e0 + (int)((uint)(lVar4 + lVar16 >> 0x12) & 0x3ff));
    puVar6[0xd] = *(undefined1 *)(local_e0 + (int)((uint)(lVar4 - lVar16 >> 0x12) & 0x3ff));
    puVar6[1] = *(undefined1 *)(local_e0 + (int)((uint)(lVar3 + lVar14 >> 0x12) & 0x3ff));
    puVar6[0xc] = *(undefined1 *)(local_e0 + (int)((uint)(lVar3 - lVar14 >> 0x12) & 0x3ff));
    puVar6[2] = *(undefined1 *)(local_e0 + (int)((uint)(lVar5 + lVar15 >> 0x12) & 0x3ff));
    puVar6[0xb] = *(undefined1 *)(local_e0 + (int)((uint)(lVar5 - lVar15 >> 0x12) & 0x3ff));
    puVar6[3] = *(undefined1 *)(local_e0 + (int)((uint)(lVar2 + lVar13 >> 0x12) & 0x3ff));
    puVar6[10] = *(undefined1 *)(local_e0 + (int)((uint)(lVar2 - lVar13 >> 0x12) & 0x3ff));
    puVar6[4] = *(undefined1 *)(local_e0 + (int)((uint)(lVar9 + lVar17 >> 0x12) & 0x3ff));
    puVar6[9] = *(undefined1 *)(local_e0 + (int)((uint)(lVar9 - lVar17 >> 0x12) & 0x3ff));
    puVar6[5] = *(undefined1 *)(local_e0 + (int)((uint)(lVar8 + lVar18 >> 0x12) & 0x3ff));
    puVar6[8] = *(undefined1 *)(local_e0 + (int)((uint)(lVar8 - lVar18 >> 0x12) & 0x3ff));
    puVar6[6] = *(undefined1 *)(local_e0 + (int)((uint)(lVar7 + lVar19 >> 0x12) & 0x3ff));
    puVar6[7] = *(undefined1 *)(local_e0 + (int)((uint)(lVar7 - lVar19 >> 0x12) & 0x3ff));
    local_d0 = local_d0 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_14x14(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 14];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z2 = MULTIPLY(z4, FIX(1.274162392));         /* c4 */
    z3 = MULTIPLY(z4, FIX(0.314692123));         /* c12 */
    z4 = MULTIPLY(z4, FIX(0.881747734));         /* c8 */

    tmp10 = z1 + z2;
    tmp11 = z1 + z3;
    tmp12 = z1 - z4;

    tmp23 = RIGHT_SHIFT(z1 - LEFT_SHIFT(z2 + z3 - z4, 1),
                        CONST_BITS - PASS1_BITS); /* c0 = (c4+c12-c8)*2 */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z3 = MULTIPLY(z1 + z2, FIX(1.105676686));    /* c6 */

    tmp13 = z3 + MULTIPLY(z1, FIX(0.273079590)); /* c2-c6 */
    tmp14 = z3 - MULTIPLY(z2, FIX(1.719280954)); /* c6+c10 */
    tmp15 = MULTIPLY(z1, FIX(0.613604268)) -     /* c10 */
            MULTIPLY(z2, FIX(1.378756276));      /* c2 */

    tmp20 = tmp10 + tmp13;
    tmp26 = tmp10 - tmp13;
    tmp21 = tmp11 + tmp14;
    tmp25 = tmp11 - tmp14;
    tmp22 = tmp12 + tmp15;
    tmp24 = tmp12 - tmp15;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp13 = LEFT_SHIFT(z4, CONST_BITS);

    tmp14 = z1 + z3;
    tmp11 = MULTIPLY(z1 + z2, FIX(1.334852607));           /* c3 */
    tmp12 = MULTIPLY(tmp14, FIX(1.197448846));             /* c5 */
    tmp10 = tmp11 + tmp12 + tmp13 - MULTIPLY(z1, FIX(1.126980169)); /* c3+c5-c1 */
    tmp14 = MULTIPLY(tmp14, FIX(0.752406978));             /* c9 */
    tmp16 = tmp14 - MULTIPLY(z1, FIX(1.061150426));        /* c9+c11-c13 */
    z1    -= z2;
    tmp15 = MULTIPLY(z1, FIX(0.467085129)) - tmp13;        /* c11 */
    tmp16 += tmp15;
    z1    += z4;
    z4    = MULTIPLY(z2 + z3, -FIX(0.158341681)) - tmp13;  /* -c13 */
    tmp11 += z4 - MULTIPLY(z2, FIX(0.424103948));          /* c3-c9-c13 */
    tmp12 += z4 - MULTIPLY(z3, FIX(2.373959773));          /* c3+c5-c13 */
    z4    = MULTIPLY(z3 - z2, FIX(1.405321284));           /* c1 */
    tmp14 += z4 + tmp13 - MULTIPLY(z3, FIX(1.6906431334)); /* c1+c9-c11 */
    tmp15 += z4 + MULTIPLY(z2, FIX(0.674957567));          /* c1+c11-c5 */

    tmp13 = LEFT_SHIFT(z1 - z3, PASS1_BITS);

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)(tmp23 + tmp13);
    wsptr[8 * 10] = (int)(tmp23 - tmp13);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 14 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 14; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z4 = (JLONG)wsptr[4];
    z2 = MULTIPLY(z4, FIX(1.274162392));         /* c4 */
    z3 = MULTIPLY(z4, FIX(0.314692123));         /* c12 */
    z4 = MULTIPLY(z4, FIX(0.881747734));         /* c8 */

    tmp10 = z1 + z2;
    tmp11 = z1 + z3;
    tmp12 = z1 - z4;

    tmp23 = z1 - LEFT_SHIFT(z2 + z3 - z4, 1);    /* c0 = (c4+c12-c8)*2 */

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[6];

    z3 = MULTIPLY(z1 + z2, FIX(1.105676686));    /* c6 */

    tmp13 = z3 + MULTIPLY(z1, FIX(0.273079590)); /* c2-c6 */
    tmp14 = z3 - MULTIPLY(z2, FIX(1.719280954)); /* c6+c10 */
    tmp15 = MULTIPLY(z1, FIX(0.613604268)) -     /* c10 */
            MULTIPLY(z2, FIX(1.378756276));      /* c2 */

    tmp20 = tmp10 + tmp13;
    tmp26 = tmp10 - tmp13;
    tmp21 = tmp11 + tmp14;
    tmp25 = tmp11 - tmp14;
    tmp22 = tmp12 + tmp15;
    tmp24 = tmp12 - tmp15;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];
    z4 = LEFT_SHIFT(z4, CONST_BITS);

    tmp14 = z1 + z3;
    tmp11 = MULTIPLY(z1 + z2, FIX(1.334852607));           /* c3 */
    tmp12 = MULTIPLY(tmp14, FIX(1.197448846));             /* c5 */
    tmp10 = tmp11 + tmp12 + z4 - MULTIPLY(z1, FIX(1.126980169)); /* c3+c5-c1 */
    tmp14 = MULTIPLY(tmp14, FIX(0.752406978));             /* c9 */
    tmp16 = tmp14 - MULTIPLY(z1, FIX(1.061150426));        /* c9+c11-c13 */
    z1    -= z2;
    tmp15 = MULTIPLY(z1, FIX(0.467085129)) - z4;           /* c11 */
    tmp16 += tmp15;
    tmp13 = MULTIPLY(z2 + z3, -FIX(0.158341681)) - z4;     /* -c13 */
    tmp11 += tmp13 - MULTIPLY(z2, FIX(0.424103948));       /* c3-c9-c13 */
    tmp12 += tmp13 - MULTIPLY(z3, FIX(2.373959773));       /* c3+c5-c13 */
    tmp13 = MULTIPLY(z3 - z2, FIX(1.405321284));           /* c1 */
    tmp14 += tmp13 + z4 - MULTIPLY(z3, FIX(1.6906431334)); /* c1+c9-c11 */
    tmp15 += tmp13 + MULTIPLY(z2, FIX(0.674957567));       /* c1+c11-c5 */

    tmp13 = LEFT_SHIFT(z1 - z3, CONST_BITS) + z4;

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp16,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}